

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindInvalidDataProcess.cpp
# Opt level: O2

int __thiscall
Assimp::FindInvalidDataProcess::ProcessMesh(FindInvalidDataProcess *this,aiMesh *pMesh)

{
  aiVector3D **in;
  aiFace *paVar1;
  bool bVar2;
  Logger *this_00;
  aiVector3D *paVar3;
  uint i;
  ulong uVar4;
  byte bVar5;
  uint m;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  uint m_1;
  uint i_1;
  long lVar10;
  reference rVar11;
  allocator_type local_5e;
  bool local_5d;
  uint local_5c;
  vector<bool,_std::allocator<bool>_> dirtyMask;
  
  local_5d = pMesh->mNumFaces != 0;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&dirtyMask,(ulong)pMesh->mNumVertices,&local_5d,&local_5e);
  for (uVar7 = 0; uVar7 < pMesh->mNumFaces; uVar7 = uVar7 + 1) {
    paVar1 = pMesh->mFaces;
    for (uVar4 = 0; uVar4 < paVar1[uVar7].mNumIndices; uVar4 = uVar4 + 1) {
      rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (&dirtyMask,(ulong)paVar1[uVar7].mIndices[uVar4]);
      *rVar11._M_p = *rVar11._M_p & ~rVar11._M_mask;
    }
  }
  if ((pMesh->mVertices != (aiVector3D *)0x0) &&
     (bVar2 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mVertices,pMesh->mNumVertices,"positions",&dirtyMask,false,true),
     bVar2)) {
    this_00 = DefaultLogger::get();
    bVar5 = 2;
    Logger::error(this_00,"Deleting mesh: Unable to continue without vertex positions");
    goto LAB_003a4493;
  }
  if (this->mIgnoreTexCoods == false) {
    lVar8 = -7;
    uVar6 = 0;
    for (lVar10 = 0; (lVar10 != 8 && (pMesh->mTextureCoords[lVar10] != (aiVector3D *)0x0));
        lVar10 = lVar10 + 1) {
      bVar2 = ProcessArray<aiVector3t<float>>
                        (pMesh->mTextureCoords + lVar10,pMesh->mNumVertices,"uvcoords",&dirtyMask,
                         false,true);
      lVar9 = lVar8;
      if (bVar2) {
        for (; pMesh->mNumUVComponents[lVar9 + 7] = 0, lVar9 != 0; lVar9 = lVar9 + 1) {
          if (*(void **)(pMesh->mNumUVComponents + lVar9 * 2) != (void *)0x0) {
            operator_delete__(*(void **)(pMesh->mNumUVComponents + lVar9 * 2));
          }
          (pMesh->mNumUVComponents + lVar9 * 2)[0] = 0;
          (pMesh->mNumUVComponents + lVar9 * 2)[1] = 0;
        }
        uVar6 = 1;
      }
      lVar8 = lVar8 + 1;
    }
  }
  else {
    uVar6 = 0;
  }
  paVar3 = pMesh->mNormals;
  if ((paVar3 != (aiVector3D *)0x0) || (pMesh->mTangents != (aiVector3D *)0x0)) {
    if ((pMesh->mPrimitiveTypes & 3) != 0) {
      if ((pMesh->mPrimitiveTypes & 0xc) == 0) goto LAB_003a448f;
      lVar8 = 8;
      local_5c = uVar6;
      for (uVar7 = 0; uVar7 < pMesh->mNumFaces; uVar7 = uVar7 + 1) {
        paVar1 = pMesh->mFaces;
        if (*(uint *)((long)paVar1 + lVar8 + -8) < 3) {
          rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                             (&dirtyMask,(ulong)**(uint **)((long)&paVar1->mNumIndices + lVar8));
          *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
          if (*(int *)((long)paVar1 + lVar8 + -8) == 2) {
            rVar11 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               (&dirtyMask,
                                (ulong)*(uint *)(*(long *)((long)&paVar1->mNumIndices + lVar8) + 4))
            ;
            *rVar11._M_p = *rVar11._M_p | rVar11._M_mask;
          }
        }
        lVar8 = lVar8 + 0x10;
      }
      paVar3 = pMesh->mNormals;
      uVar6 = local_5c;
    }
    if (paVar3 != (aiVector3D *)0x0) {
      bVar2 = ProcessArray<aiVector3t<float>>
                        (&pMesh->mNormals,pMesh->mNumVertices,"normals",&dirtyMask,true,false);
      uVar6 = uVar6 & 0xff;
      if (bVar2) {
        uVar6 = 1;
      }
    }
    in = &pMesh->mTangents;
    if ((pMesh->mTangents != (aiVector3D *)0x0) &&
       (bVar2 = ProcessArray<aiVector3t<float>>
                          (in,pMesh->mNumVertices,"tangents",&dirtyMask,false,true), bVar2)) {
      if (pMesh->mBitangents != (aiVector3D *)0x0) {
        operator_delete__(pMesh->mBitangents);
      }
      pMesh->mBitangents = (aiVector3D *)0x0;
      uVar6 = 1;
    }
    if ((pMesh->mBitangents != (aiVector3D *)0x0) &&
       (bVar2 = ProcessArray<aiVector3t<float>>
                          (&pMesh->mBitangents,pMesh->mNumVertices,"bitangents",&dirtyMask,false,
                           true), bVar2)) {
      if (*in != (aiVector3D *)0x0) {
        operator_delete__(*in);
      }
      *in = (aiVector3D *)0x0;
      uVar6 = 1;
    }
  }
LAB_003a448f:
  bVar5 = (byte)uVar6 & 1;
LAB_003a4493:
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&dirtyMask.super__Bvector_base<std::allocator<bool>_>);
  return (uint)bVar5;
}

Assistant:

int FindInvalidDataProcess::ProcessMesh(aiMesh* pMesh)
{
    bool ret = false;
    std::vector<bool> dirtyMask(pMesh->mNumVertices, pMesh->mNumFaces != 0);

    // Ignore elements that are not referenced by vertices.
    // (they are, for example, caused by the FindDegenerates step)
    for (unsigned int m = 0; m < pMesh->mNumFaces; ++m) {
        const aiFace& f = pMesh->mFaces[m];

        for (unsigned int i = 0; i < f.mNumIndices; ++i) {
            dirtyMask[f.mIndices[i]] = false;
        }
    }

    // Process vertex positions
    if (pMesh->mVertices && ProcessArray(pMesh->mVertices, pMesh->mNumVertices, "positions", dirtyMask)) {
        ASSIMP_LOG_ERROR("Deleting mesh: Unable to continue without vertex positions");

        return 2;
    }

    // process texture coordinates
    if (!mIgnoreTexCoods) {
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS && pMesh->mTextureCoords[i]; ++i) {
            if (ProcessArray(pMesh->mTextureCoords[i], pMesh->mNumVertices, "uvcoords", dirtyMask)) {
                pMesh->mNumUVComponents[i] = 0;

                // delete all subsequent texture coordinate sets.
                for (unsigned int a = i + 1; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
                    delete[] pMesh->mTextureCoords[a];
                    pMesh->mTextureCoords[a] = NULL;
                    pMesh->mNumUVComponents[a] = 0;
                }

                ret = true;
            }
        }
    }

    // -- we don't validate vertex colors, it's difficult to say whether
    // they are invalid or not.

    // Normals and tangents are undefined for point and line faces.
    if (pMesh->mNormals || pMesh->mTangents)    {

        if (aiPrimitiveType_POINT & pMesh->mPrimitiveTypes ||
            aiPrimitiveType_LINE  & pMesh->mPrimitiveTypes)
        {
            if (aiPrimitiveType_TRIANGLE & pMesh->mPrimitiveTypes ||
                aiPrimitiveType_POLYGON  & pMesh->mPrimitiveTypes)
            {
                // We need to update the lookup-table
                for (unsigned int m = 0; m < pMesh->mNumFaces;++m) {
                    const aiFace& f = pMesh->mFaces[ m ];

                    if (f.mNumIndices < 3)  {
                        dirtyMask[f.mIndices[0]] = true;
                        if (f.mNumIndices == 2) {
                            dirtyMask[f.mIndices[1]] = true;
                        }
                    }
                }
            }
            // Normals, tangents and bitangents are undefined for
            // the whole mesh (and should not even be there)
            else {
                return ret;
            }
        }

        // Process mesh normals
        if (pMesh->mNormals && ProcessArray(pMesh->mNormals,pMesh->mNumVertices,
            "normals",dirtyMask,true,false))
            ret = true;

        // Process mesh tangents
        if (pMesh->mTangents && ProcessArray(pMesh->mTangents,pMesh->mNumVertices,"tangents",dirtyMask))    {
            delete[] pMesh->mBitangents; pMesh->mBitangents = NULL;
            ret = true;
        }

        // Process mesh bitangents
        if (pMesh->mBitangents && ProcessArray(pMesh->mBitangents,pMesh->mNumVertices,"bitangents",dirtyMask))  {
            delete[] pMesh->mTangents; pMesh->mTangents = NULL;
            ret = true;
        }
    }
    return ret ? 1 : 0;
}